

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qobject.cpp
# Opt level: O2

void QObject::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  QObject *pQVar6;
  QObject *parent;
  long in_FS_OFFSET;
  QUntypedBindable QVar7;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      pQVar6 = *_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0029036b:
        destroyed(_o,pQVar6);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        pQVar6 = (QObject *)0x0;
        goto LAB_0029036b;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        objectNameChanged(_o,_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        deleteLater(_o);
        return;
      }
      break;
    default:
      goto switchD_00290148_default;
    }
    goto LAB_002903a7;
  case ReadProperty:
    if (_id == 0) {
      puVar1 = (undefined8 *)*_a;
      objectName((QString *)&local_38,_o);
      pDVar3 = (Data *)*puVar1;
      pcVar4 = (char16_t *)puVar1[1];
      *puVar1 = local_38.d;
      puVar1[1] = local_38.ptr;
      qVar2 = puVar1[2];
      puVar1[2] = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        doSetObjectName(_o,(QString *)*_a);
        return;
      }
      goto LAB_002903a7;
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      QVar7 = (QUntypedBindable)bindableObjectName(_o);
      *(QUntypedBindable *)*_a = QVar7;
    }
    break;
  case CreateInstance:
    if (_id == 1) {
      pQVar6 = (QObject *)operator_new(0x10);
      QObject(pQVar6,(QObject *)0x0);
    }
    else {
      if (_id != 0) break;
      pQVar6 = (QObject *)operator_new(0x10);
      QObject(pQVar6,*_a[1]);
    }
    if ((undefined8 *)*_a != (undefined8 *)0x0) {
      *(QObject **)*_a = pQVar6;
    }
    break;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::indexOfMethod<void(QObject::*)(QObject*)>
                      ((QtMocHelpers *)_a,(void **)destroyed,0,0);
    if (!bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QObject::*)(QString_const&,QObject::QPrivateSignal)>
                  ((QtMocHelpers *)_a,(void **)objectNameChanged,0,2);
        return;
      }
      goto LAB_002903a7;
    }
    break;
  case ConstructInPlace:
    if (_id == 1) {
      pQVar6 = (QObject *)*_a;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        parent = (QObject *)0x0;
LAB_002902cc:
        QObject(pQVar6,parent);
        return;
      }
      goto LAB_002903a7;
    }
    if (_id == 0) {
      pQVar6 = (QObject *)*_a;
      parent = *_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) goto LAB_002902cc;
      goto LAB_002903a7;
    }
  }
switchD_00290148_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_002903a7:
  __stack_chk_fail();
}

Assistant:

void QObject::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QObject *>(_o);
    if (_c == QMetaObject::CreateInstance) {
        switch (_id) {
        case 0: { QObject *_r = new QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1])));
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        case 1: { QObject *_r = new QObject();
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        default: break;
        }
    }
    if (_c == QMetaObject::ConstructInPlace) {
        switch (_id) {
        case 0: { new (_a[0]) QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1]))); } break;
        case 1: { new (_a[0]) QObject(); } break;
        default: break;
        }
    }
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->destroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 1: _t->destroyed(); break;
        case 2: _t->objectNameChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->deleteLater(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(QObject * )>(_a, &QObject::destroyed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(const QString & , QPrivateSignal)>(_a, &QObject::objectNameChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->objectName(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setObjectName(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableObjectName(); break;
        default: break;
        }
    }
}